

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::TruncateOutputLog(cmake *this,char *fname)

{
  bool bVar1;
  int iVar2;
  string *str;
  char *__file;
  pointer this_00;
  off_t maxFileSize;
  off_t fsize;
  allocator<char> local_159;
  string local_158;
  cmValue local_138;
  undefined4 local_12c;
  undefined1 local_128 [8];
  stat st;
  cmAlphaNum local_68;
  undefined1 local_38 [8];
  string fullPath;
  char *fname_local;
  cmake *this_local;
  
  fullPath.field_2._8_8_ = fname;
  str = GetHomeOutputDirectory_abi_cxx11_(this);
  cmAlphaNum::cmAlphaNum(&local_68,str);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)(st.__glibc_reserved + 2),'/');
  cmStrCat<char_const*>
            ((string *)local_38,&local_68,(cmAlphaNum *)(st.__glibc_reserved + 2),
             (char **)((long)&fullPath.field_2 + 8));
  __file = (char *)std::__cxx11::string::c_str();
  iVar2 = stat(__file,(stat *)local_128);
  if (iVar2 == 0) {
    this_00 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"CMAKE_CACHEFILE_DIR",&local_159);
    local_138 = cmState::GetInitializedCacheValue(this_00,&local_158);
    bVar1 = cmValue::operator_cast_to_bool(&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if ((long)st.st_rdev < 0xc800) {
        local_12c = 1;
      }
      else {
        local_12c = 0;
      }
    }
    else {
      cmsys::SystemTools::RemoveFile((string *)local_38);
      local_12c = 1;
    }
  }
  else {
    local_12c = 1;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmake::TruncateOutputLog(const char* fname)
{
  std::string fullPath = cmStrCat(this->GetHomeOutputDirectory(), '/', fname);
  struct stat st;
  if (::stat(fullPath.c_str(), &st)) {
    return;
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR")) {
    cmSystemTools::RemoveFile(fullPath);
    return;
  }
  off_t fsize = st.st_size;
  const off_t maxFileSize = 50 * 1024;
  if (fsize < maxFileSize) {
    // TODO: truncate file
    return;
  }
}